

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_0::CompositeExtractFeedingConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DefUseManager *this;
  Instruction *pIVar5;
  uint32_t i;
  uint index;
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac;
  undefined8 local_a8;
  SmallVector<unsigned_int,_2UL> SStack_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  if (inst->opcode_ != OpCompositeConstruct) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeConstruct && \"Wrong opcode.  Should be OpCompositeConstruct.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x6da,
                  "bool spvtools::opt::(anonymous namespace)::CompositeExtractFeedingConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  this = IRContext::get_def_use_mgr(context);
  uVar2 = Instruction::NumInOperands(inst);
  index = 0;
  if (uVar2 != 0) {
    this_00 = (Instruction *)0x0;
    uVar2 = 0;
    while( true ) {
      uVar3 = Instruction::NumInOperands(inst);
      if (uVar3 <= index) break;
      uVar3 = Instruction::GetSingleWordInOperand(inst,index);
      pIVar5 = analysis::DefUseManager::GetDef(this,uVar3);
      if (this_00 == (Instruction *)0x0) {
        this_00 = pIVar5;
      }
      if ((pIVar5->opcode_ != OpCompositeExtract) ||
         (bVar1 = HaveSameIndexesExceptForLast(pIVar5,this_00), !bVar1)) goto LAB_004bc15d;
      uVar3 = Instruction::NumInOperands(pIVar5);
      uVar3 = Instruction::GetSingleWordInOperand(pIVar5,uVar3 - 1);
      if ((index != uVar3) ||
         ((uVar4 = Instruction::GetSingleWordInOperand(pIVar5,0), uVar3 = uVar4, index != 0 &&
          (uVar3 = uVar2, uVar2 != uVar4)))) goto LAB_004bc15d;
      uVar2 = uVar3;
      index = index + 1;
    }
    if (this_00 == (Instruction *)0x0) {
      __assert_fail("first_element_inst != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x704,
                    "bool spvtools::opt::(anonymous namespace)::CompositeExtractFeedingConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                   );
    }
    pIVar5 = analysis::DefUseManager::GetDef(this,uVar2);
    uVar3 = Instruction::type_id(pIVar5);
    uVar3 = GetElementType(uVar3,(this_00->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3,
                           (this_00->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,this);
    uVar4 = Instruction::type_id(inst);
    if (uVar4 == uVar3) {
      uVar3 = Instruction::NumInOperands(this_00);
      if (uVar3 == 2) {
        inst->opcode_ = OpCopyObject;
        init_list._M_len = 1;
        init_list._M_array = &local_ac;
        local_ac = uVar2;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
        local_a8 = CONCAT44(local_a8._4_4_,1);
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&SStack_a0,&local_58);
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_78,&local_a8,&local_78);
        Instruction::SetInOperands(inst,(OperandList *)&local_78);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_78);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&SStack_a0);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      }
      else {
        inst->opcode_ = OpCompositeExtract;
        local_a8 = 0;
        SStack_a0._vptr_SmallVector = (_func_int **)0x0;
        SStack_a0.size_ = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_a8,
                   (this_00->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2,
                   (this_00->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        Instruction::SetInOperands(inst,(OperandList *)&local_a8);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_a8);
      }
      index = 1;
    }
    else {
LAB_004bc15d:
      index = 0;
    }
  }
  return SUB41(index,0);
}

Assistant:

bool CompositeExtractFeedingConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeConstruct &&
         "Wrong opcode.  Should be OpCompositeConstruct.");
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
  uint32_t original_id = 0;

  if (inst->NumInOperands() == 0) {
    // The struct being constructed has no members.
    return false;
  }

  // Check each element to make sure they are:
  // - extractions
  // - extracting the same position they are inserting
  // - all extract from the same id.
  Instruction* first_element_inst = nullptr;
  for (uint32_t i = 0; i < inst->NumInOperands(); ++i) {
    const uint32_t element_id = inst->GetSingleWordInOperand(i);
    Instruction* element_inst = def_use_mgr->GetDef(element_id);
    if (first_element_inst == nullptr) {
      first_element_inst = element_inst;
    }

    if (element_inst->opcode() != spv::Op::OpCompositeExtract) {
      return false;
    }

    if (!HaveSameIndexesExceptForLast(element_inst, first_element_inst)) {
      return false;
    }

    if (element_inst->GetSingleWordInOperand(element_inst->NumInOperands() -
                                             1) != i) {
      return false;
    }

    if (i == 0) {
      original_id =
          element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
    } else if (original_id !=
               element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx)) {
      return false;
    }
  }
  assert(first_element_inst != nullptr);

  // The last check it to see that the object being extracted from is the
  // correct type.
  Instruction* original_inst = def_use_mgr->GetDef(original_id);
  uint32_t original_type_id =
      GetElementType(original_inst->type_id(), first_element_inst->begin() + 3,
                     first_element_inst->end() - 1, def_use_mgr);

  if (inst->type_id() != original_type_id) {
    return false;
  }

  if (first_element_inst->NumInOperands() == 2) {
    // Simplify by using the original object.
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {original_id}}});
    return true;
  }

  // Copies the original id and all indexes except for the last to the new
  // extract instruction.
  inst->SetOpcode(spv::Op::OpCompositeExtract);
  inst->SetInOperands(std::vector<Operand>(first_element_inst->begin() + 2,
                                           first_element_inst->end() - 1));
  return true;
}